

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void swrenderer::rt_flip_posts(void)

{
  uint *puVar1;
  uint *local_18;
  uint *back;
  uint *front;
  
  puVar1 = *(uint **)(drawerargs::dc_ctspan + (long)(int)(drawerargs::dc_x & 3) * 8);
  for (back = (uint *)(&drawerargs::horizspan)[(int)(drawerargs::dc_x & 3)]; local_18 = puVar1 + -2,
      back < local_18; back = back + 2) {
    swapvalues<unsigned_int>(back,local_18);
    swapvalues<unsigned_int>(back + 1,puVar1 + -1);
    puVar1 = local_18;
  }
  return;
}

Assistant:

void rt_flip_posts()
	{
		using namespace drawerargs;

		unsigned int *front = horizspan[dc_x & 3];
		unsigned int *back = dc_ctspan[dc_x & 3] - 2;

		while (front < back)
		{
			swapvalues(front[0], back[0]);
			swapvalues(front[1], back[1]);
			front += 2;
			back -= 2;
		}
	}